

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O3

XmlRpcClient * __thiscall
miniros::RPCManager::getXMLRPCClient(RPCManager *this,string *host,int port,string *uri)

{
  pointer *ppCVar1;
  size_t sVar2;
  iterator __position;
  bool bVar3;
  int iVar4;
  XmlRpcClient *this_00;
  SteadyTime SVar5;
  TimeBase<miniros::SteadyTime,_miniros::WallDuration> TVar6;
  pointer pCVar7;
  pointer __src;
  pointer __dest;
  CachedXmlRpcClient local_50;
  TimeBase<miniros::SteadyTime,_miniros::WallDuration> local_38;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->clients_mutex_);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  __dest = (this->clients_).
           super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar7 = (this->clients_).
           super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__dest != pCVar7) {
    do {
      if (__dest->in_use_ == false) {
        this_00 = __dest->client_;
        sVar2 = (this_00->_host)._M_string_length;
        if (sVar2 == host->_M_string_length) {
          if (sVar2 != 0) {
            iVar4 = bcmp((this_00->_host)._M_dataplus._M_p,(host->_M_dataplus)._M_p,sVar2);
            if (iVar4 != 0) goto LAB_001f717c;
          }
          if ((this_00->_port == port) &&
             (sVar2 = (this_00->_uri)._M_string_length, sVar2 == uri->_M_string_length)) {
            if (sVar2 != 0) {
              iVar4 = bcmp((this_00->_uri)._M_dataplus._M_p,(uri->_M_dataplus)._M_p,sVar2);
              if (iVar4 != 0) goto LAB_001f717c;
            }
            if ((this_00->_connectionState == IDLE) || (this_00->_connectionState == NO_CONNECTION))
            {
              __dest->in_use_ = true;
              TVar6 = (TimeBase<miniros::SteadyTime,_miniros::WallDuration>)SteadyTime::now();
              (__dest->last_use_time_).super_TimeBase<miniros::SteadyTime,_miniros::WallDuration> =
                   TVar6;
              goto LAB_001f7277;
            }
          }
        }
LAB_001f717c:
        SVar5 = TimeBase<miniros::SteadyTime,_miniros::WallDuration>::operator+
                          (&(__dest->last_use_time_).
                            super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>,
                           (WallDuration *)&CachedXmlRpcClient::s_zombie_time_);
        local_50._0_4_ = SVar5.super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>.sec;
        local_50.last_use_time_.super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>.sec =
             SVar5.super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>.nsec;
        local_38 = (TimeBase<miniros::SteadyTime,_miniros::WallDuration>)SteadyTime::now();
        bVar3 = TimeBase<miniros::SteadyTime,_miniros::WallDuration>::operator<
                          ((TimeBase<miniros::SteadyTime,_miniros::WallDuration> *)&local_50,
                           (SteadyTime *)&local_38);
        if (bVar3) {
          if (__dest->client_ != (XmlRpcClient *)0x0) {
            (*(__dest->client_->super_XmlRpcSource)._vptr_XmlRpcSource[1])();
          }
          __src = __dest + 1;
          pCVar7 = (this->clients_).
                   super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (__src != pCVar7) {
            memmove(__dest,__src,(long)pCVar7 - (long)__src);
            pCVar7 = (this->clients_).
                     super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          pCVar7 = pCVar7 + -1;
          (this->clients_).
          super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
          ._M_impl.super__Vector_impl_data._M_finish = pCVar7;
        }
        else {
          __dest = __dest + 1;
          pCVar7 = (this->clients_).
                   super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      else {
        __dest = __dest + 1;
      }
    } while (__dest != pCVar7);
  }
  this_00 = (XmlRpcClient *)operator_new(0xf8);
  XmlRpc::XmlRpcClient::XmlRpcClient(this_00,(host->_M_dataplus)._M_p,port,(uri->_M_dataplus)._M_p);
  local_50.in_use_ = true;
  local_50.client_ = this_00;
  SVar5 = SteadyTime::now();
  local_50.last_use_time_.super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>.sec =
       SVar5.super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>.sec;
  local_50.last_use_time_.super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>.nsec =
       SVar5.super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>.nsec;
  __position._M_current =
       (this->clients_).
       super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->clients_).
      super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<miniros::CachedXmlRpcClient,std::allocator<miniros::CachedXmlRpcClient>>::
    _M_realloc_insert<miniros::CachedXmlRpcClient_const&>
              ((vector<miniros::CachedXmlRpcClient,std::allocator<miniros::CachedXmlRpcClient>> *)
               &this->clients_,__position,&local_50);
  }
  else {
    (__position._M_current)->client_ = local_50.client_;
    (__position._M_current)->in_use_ = (bool)local_50.in_use_;
    *(int3 *)&(__position._M_current)->field_0x1 = local_50._1_3_;
    ((__position._M_current)->last_use_time_).
    super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>.sec =
         local_50.last_use_time_.super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>.sec;
    *(ulong *)&((__position._M_current)->last_use_time_).
               super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>.nsec =
         CONCAT44(local_50._12_4_,
                  local_50.last_use_time_.super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>
                  .nsec);
    ppCVar1 = &(this->clients_).
               super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppCVar1 = *ppCVar1 + 1;
  }
LAB_001f7277:
  pthread_mutex_unlock((pthread_mutex_t *)&this->clients_mutex_);
  return this_00;
}

Assistant:

XmlRpcClient* RPCManager::getXMLRPCClient(const std::string &host, const int port, const std::string &uri)
{
  // go through our vector of clients and grab the first available one
  XmlRpcClient *c = nullptr;

  std::scoped_lock<std::mutex> lock(clients_mutex_);

  for (auto i = clients_.begin(); !c && i != clients_.end(); )
  {
    if (!i->in_use_)
    {
      // see where it's pointing
      if (i->client_->getHost() == host &&
          i->client_->getPort() == port &&
          i->client_->getUri()  == uri)
      {
        // hooray, it's pointing at our destination. re-use it.
        if (i->client_->isReady()) {
          c = i->client_;
          i->in_use_ = true;
          i->last_use_time_ = SteadyTime::now();
          break;
        }
      }
      if (i->last_use_time_ + CachedXmlRpcClient::s_zombie_time_ < SteadyTime::now())
      {
        // toast this guy. he's dead and nobody is reusing him.
        delete i->client_;
        i = clients_.erase(i);
      }
      else
      {
        ++i; // move along. this guy isn't dead yet.
      }
    }
    else
    {
      ++i;
    }
  }

  if (!c)
  {
    // allocate a new one
    c = new XmlRpcClient(host.c_str(), port, uri.c_str());
    CachedXmlRpcClient mc(c);
    mc.in_use_ = true;
    mc.last_use_time_ = SteadyTime::now();
    clients_.push_back(mc);
    //ROS_INFO("%d xmlrpc clients allocated\n", xmlrpc_clients.size());
  }
  // ONUS IS ON THE RECEIVER TO UNSET THE IN_USE FLAG
  // by calling releaseXMLRPCClient
  return c;
}